

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createSphereShapedHair
          (Vec3fa *center,float radius,Ref<embree::SceneGraph::MaterialNode> *material)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  reference pvVar8;
  unsigned_long *puVar9;
  Vec3fx *pVVar10;
  long *in_RDX;
  undefined8 *in_RSI;
  Node *in_RDI;
  float in_XMM0_Da;
  Ref<embree::SceneGraph::HairSetNode> mesh;
  Vec3fx v_3;
  Vec3fx v_2;
  Vec3fx v_1;
  Vec3fx v;
  vint4 mask;
  vint4 mask_1;
  vint4 mask_2;
  vint4 mask_3;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t i_7;
  size_t i_6;
  Vec3fx *old_items_1;
  size_t i_5;
  size_t i_4;
  size_t i_11;
  size_t i_10;
  Vec3fx *old_items_2;
  size_t i_9;
  size_t i_8;
  size_t i_15;
  size_t i_14;
  Vec3fx *old_items_3;
  size_t i_13;
  size_t i_12;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  size_t new_size_alloced_2;
  size_t new_size_alloced_3;
  value_type *in_stack_ffffffffffffeed8;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_ffffffffffffeee0;
  size_t in_stack_ffffffffffffeee8;
  size_t in_stack_ffffffffffffef80;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_ffffffffffffef88;
  undefined8 in_stack_ffffffffffffef90;
  RTCGeometryType type;
  HairSetNode *in_stack_ffffffffffffef98;
  BBox1f in_stack_ffffffffffffefa0;
  reference pvVar11;
  ulong local_f98 [3];
  ulong uStack_f80;
  undefined1 local_f78 [8];
  ulong uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  ulong uStack_f50;
  undefined1 local_f48 [8];
  ulong uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  ulong uStack_f20;
  undefined1 local_f18 [8];
  ulong uStack_f10;
  ulong local_f08 [3];
  ulong uStack_ef0;
  undefined1 local_ee8 [8];
  ulong uStack_ee0;
  Hair local_ed0;
  undefined1 local_ec5;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined4 uStack_eb8;
  long *local_ea8;
  _func_int **local_ea0 [2];
  float local_e8c;
  undefined8 *local_e88;
  long **local_e70;
  undefined4 *local_e68;
  undefined4 *local_e60;
  undefined4 *local_e58;
  long **local_e50;
  ulong *local_e40;
  undefined8 *local_e38;
  ulong *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined8 *local_e08;
  undefined8 *local_e00;
  ulong *local_df8;
  undefined8 *local_df0;
  ulong *local_de8;
  undefined4 local_ddc;
  undefined4 local_dd8;
  float local_dd4;
  ulong *local_dd0;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined8 *local_db8;
  undefined4 local_dac;
  undefined4 local_da8;
  undefined4 local_da4;
  undefined8 *local_da0;
  undefined4 local_d94;
  undefined4 local_d90;
  float local_d8c;
  ulong *local_d88;
  _func_int **local_d80;
  _func_int ***local_d78;
  _func_int ***local_d70;
  _func_int ***local_d68;
  _func_int ***local_d60;
  _func_int ***local_d58;
  _func_int ***local_d50;
  undefined8 local_d48;
  ulong uStack_d40;
  undefined1 *local_d38;
  reference local_d30;
  undefined8 local_d28;
  ulong uStack_d20;
  undefined1 *local_d18;
  reference local_d10;
  undefined8 local_d08;
  ulong uStack_d00;
  undefined1 *local_cf8;
  reference local_cf0;
  undefined8 local_ce8;
  ulong uStack_ce0;
  undefined1 *local_cd8;
  reference local_cd0;
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined1 local_c98 [8];
  ulong uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c6c;
  ulong *local_c68;
  undefined1 *local_c60;
  undefined1 local_c58 [16];
  undefined1 local_c48 [16];
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined1 local_c28 [8];
  ulong uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float local_bfc;
  undefined8 *local_bf8;
  undefined1 *local_bf0;
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined1 local_bb8 [8];
  ulong uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b8c;
  undefined8 *local_b88;
  undefined1 *local_b80;
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined1 local_b48 [8];
  ulong uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  float local_b1c;
  ulong *local_b18;
  undefined1 *local_b10;
  _func_int ***local_b08;
  _func_int ***local_af8;
  ulong local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  ulong *local_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 *local_a30;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined8 *local_a10;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  ulong *local_9f0;
  ulong local_9e8;
  undefined8 uStack_9e0;
  float local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  ulong local_988;
  undefined8 uStack_980;
  float local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined1 *local_950;
  undefined1 *local_930;
  undefined1 *local_910;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_888;
  Vec3fx *local_880;
  undefined1 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  Vec3fx *local_860;
  undefined1 *local_858;
  undefined8 *local_850;
  undefined8 *local_848;
  Vec3fx *local_840;
  undefined1 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  Vec3fx *local_820;
  undefined1 *local_818;
  undefined8 *local_810;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined8 *local_7f8;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined8 *local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined8 *local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined8 *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  undefined8 *local_798;
  undefined1 *local_790;
  ulong uStack_780;
  undefined1 *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  undefined8 *local_748;
  undefined1 *local_740;
  ulong uStack_730;
  undefined1 *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  undefined8 *local_6f8;
  undefined1 *local_6f0;
  ulong uStack_6e0;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  ulong uStack_690;
  undefined1 *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d0;
  float local_5c4;
  undefined1 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float local_5a4;
  undefined1 *local_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_588;
  float local_584;
  undefined1 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float local_564;
  undefined1 *local_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_508;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  ulong uStack_4a0;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  ulong uStack_480;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  ulong uStack_460;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  ulong uStack_440;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_308;
  undefined8 uStack_300;
  _func_int **local_2f0;
  ulong local_2e0;
  ulong local_2d8;
  Vec3fx *local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  size_t local_2b8;
  ulong local_2b0;
  reference local_2a8;
  size_t local_2a0;
  reference local_298;
  Vec3fx *local_290;
  Vec3fx *local_288;
  size_t local_280;
  Vec3fx *local_278;
  reference local_270;
  ulong local_268;
  ulong local_260;
  Vec3fx *local_258;
  ulong local_250;
  ulong local_248;
  size_t local_240;
  ulong local_238;
  reference local_230;
  size_t local_228;
  reference local_220;
  Vec3fx *local_218;
  Vec3fx *local_210;
  size_t local_208;
  Vec3fx *local_200;
  reference local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  Vec3fx *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  reference local_1b8;
  size_t local_1b0;
  reference local_1a8;
  Vec3fx *local_1a0;
  Vec3fx *local_198;
  size_t local_190;
  Vec3fx *local_188;
  reference local_180;
  ulong local_178;
  ulong local_170;
  Vec3fx *local_168;
  ulong local_160;
  ulong local_158;
  size_t local_150;
  ulong local_148;
  reference local_140;
  size_t local_138;
  reference local_130;
  Vec3fx *local_128;
  Vec3fx *local_120;
  size_t local_118;
  Vec3fx *local_110;
  reference local_108;
  unsigned_long local_100 [2];
  ulong local_f0;
  ulong local_e8;
  reference local_e0;
  size_t local_d8;
  unsigned_long local_d0 [2];
  ulong local_c0;
  ulong local_b8;
  reference local_b0;
  size_t local_a8;
  unsigned_long local_a0 [2];
  ulong local_90;
  ulong local_88;
  reference local_80;
  size_t local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  ulong local_58;
  reference local_50;
  size_t local_48;
  Vec3fx *local_40;
  Vec3fx *local_38;
  Vec3fx *local_30;
  Vec3fx *local_28;
  Vec3fx *local_20;
  Vec3fx *local_18;
  Vec3fx *local_10;
  Vec3fx *local_8;
  
  type = (RTCGeometryType)((ulong)in_stack_ffffffffffffef90 >> 0x20);
  local_e8c = in_XMM0_Da;
  local_e88 = in_RSI;
  pp_Var7 = (_func_int **)::operator_new(0x118);
  local_ec5 = 1;
  local_e70 = &local_ea8;
  local_ea8 = (long *)*in_RDX;
  if (local_ea8 != (long *)0x0) {
    (**(code **)(*local_ea8 + 0x10))();
  }
  local_ec0 = 0;
  local_ec4 = 0x3f800000;
  local_e58 = &local_ebc;
  local_e60 = &local_ec0;
  local_e68 = &local_ec4;
  local_ebc = 0;
  uStack_eb8 = 0x3f800000;
  HairSetNode::HairSetNode
            (in_stack_ffffffffffffef98,type,in_stack_ffffffffffffef88,in_stack_ffffffffffffefa0,
             in_stack_ffffffffffffef80);
  local_ec5 = 0;
  local_d78 = local_ea0;
  local_d80 = pp_Var7;
  local_ea0[0] = pp_Var7;
  if (pp_Var7 != (_func_int **)0x0) {
    (**(code **)(*pp_Var7 + 0x10))();
  }
  local_e50 = &local_ea8;
  if (local_ea8 != (long *)0x0) {
    (**(code **)(*local_ea8 + 0x18))();
  }
  local_d50 = local_ea0;
  HairSetNode::Hair::Hair(&local_ed0,0,0);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::push_back(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8);
  local_d58 = local_ea0;
  pvVar8 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_ea0[0] + 0xf),0);
  local_dd4 = -local_e8c;
  local_dd0 = local_f08;
  local_dd8 = 0;
  local_ddc = 0;
  local_96c = 0;
  local_970 = 0;
  local_974 = 0;
  local_ae8 = (ulong)(uint)local_dd4;
  uStack_980 = 0;
  local_f08[1] = 0;
  local_de8 = local_f08 + 2;
  local_df0 = local_e88;
  local_df8 = local_f08;
  uVar2 = *local_e88;
  uVar3 = local_e88[1];
  uStack_ae0 = 0;
  local_ad8._0_4_ = (float)uVar2;
  local_ad8._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_ad0._0_4_ = (float)uVar3;
  uStack_ad0._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_a68 = (float)local_ad8 + local_dd4;
  fStack_a64 = local_ad8._4_4_ + 0.0;
  fStack_a60 = (float)uStack_ad0 + 0.0;
  fStack_a5c = uStack_ad0._4_4_ + 0.0;
  local_a50 = local_f08 + 2;
  uVar4 = CONCAT44(fStack_a64,local_a68);
  uVar5 = CONCAT44(fStack_a5c,fStack_a60);
  local_c60 = local_ee8;
  local_c68 = local_f08 + 2;
  local_c6c = local_e8c;
  local_7b0 = &local_c88;
  local_7b4 = 0xffffffff;
  local_7b8 = 0xffffffff;
  local_7bc = 0xffffffff;
  local_7c0 = 0;
  local_51c = 0;
  local_520 = 0xffffffff;
  local_524 = 0xffffffff;
  local_528 = 0xffffffff;
  local_538 = 0xffffffffffffffff;
  uStack_530 = 0xffffffff;
  local_c88 = 0xffffffffffffffff;
  uStack_c80 = 0xffffffff;
  local_650 = &local_c88;
  local_898 = 0xffffffffffffffff;
  uStack_890 = 0xffffffff;
  local_6a8 = &local_ca8;
  local_ca8 = 0xffffffffffffffff;
  uStack_ca0 = 0xffffffff;
  local_ce8 = local_f08[2];
  local_8f0 = local_cb8;
  local_6b8 = local_cc8;
  local_564 = local_e8c;
  local_53c = local_e8c;
  local_558 = local_e8c;
  fStack_554 = local_e8c;
  fStack_550 = local_e8c;
  fStack_54c = local_e8c;
  local_6a0 = local_c98;
  local_428 = 0xffffffffffffffff;
  uStack_420 = 0xffffffff;
  uStack_4a0 = uStack_ef0 & 0xffffffff;
  local_368 = 0xffffffffffffffff;
  uStack_360 = 0xffffffff;
  local_4b8 = 0;
  uStack_4b4 = 0;
  uStack_4b0 = 0;
  uStack_690 = uStack_4a0 | (ulong)(uint)local_e8c << 0x20;
  local_680 = local_c98;
  local_8d0 = local_c98;
  local_cd8 = local_ee8;
  local_870 = &local_ce8;
  local_2b0 = pvVar8->size_active;
  local_e8 = pvVar8->size_active + 1;
  local_cd0 = pvVar8;
  local_ad8 = uVar2;
  uStack_ad0 = uVar3;
  local_988 = local_ae8;
  local_978 = local_dd4;
  local_878 = local_cd8;
  local_6b0 = local_8f0;
  local_678 = local_6b8;
  local_670 = local_8f0;
  local_5e8 = local_898;
  uStack_5e0 = uStack_890;
  local_5d0 = local_6a8;
  local_560 = local_6b8;
  local_3b8 = local_6a8;
  local_3b0 = local_6a8;
  local_e0 = pvVar8;
  local_f08[0] = local_ae8;
  local_f08[2] = uVar4;
  uStack_ef0 = uVar5;
  uStack_ee0 = uStack_690;
  uStack_ce0 = uStack_690;
  uStack_c90 = uStack_690;
  if (pvVar8->size_alloced < local_e8) {
    local_d8 = local_e8;
    if (pvVar8->size_alloced != 0) {
      local_f0 = pvVar8->size_alloced;
      while (local_f0 < local_e8) {
        local_100[1] = 1;
        local_100[0] = local_f0 << 1;
        puVar9 = std::max<unsigned_long>(local_100 + 1,local_100);
        local_f0 = *puVar9;
      }
      local_d8 = local_f0;
    }
  }
  else {
    local_d8 = pvVar8->size_alloced;
  }
  local_2b8 = local_d8;
  uVar6 = local_2b0;
  if (local_2b0 < pvVar8->size_active) {
    while (local_2c0 = uVar6, local_2c0 < pvVar8->size_active) {
      uVar6 = local_2c0 + 1;
    }
    pvVar8->size_active = local_2b0;
  }
  local_2a8 = pvVar8;
  if (local_d8 == pvVar8->size_alloced) {
    for (local_2c8 = pvVar8->size_active; local_2c8 < local_2b0; local_2c8 = local_2c8 + 1) {
      local_10 = pvVar8->items + local_2c8;
    }
    pvVar8->size_active = local_2b0;
  }
  else {
    local_2d0 = pvVar8->items;
    local_2a0 = local_d8;
    local_298 = pvVar8;
    pVVar10 = (Vec3fx *)alignedMalloc(in_stack_ffffffffffffeee8,(size_t)in_stack_ffffffffffffeee0);
    pvVar8->items = pVVar10;
    for (local_2d8 = 0; local_2d8 < pvVar8->size_active; local_2d8 = local_2d8 + 1) {
      local_288 = pvVar8->items + local_2d8;
      local_290 = local_2d0 + local_2d8;
      uVar2 = *(undefined8 *)((long)&local_290->field_0 + 8);
      *(undefined8 *)&local_288->field_0 = *(undefined8 *)&local_290->field_0;
      *(undefined8 *)((long)&local_288->field_0 + 8) = uVar2;
    }
    for (local_2e0 = pvVar8->size_active; local_2e0 < local_2b0; local_2e0 = local_2e0 + 1) {
      local_8 = pvVar8->items + local_2e0;
    }
    local_280 = pvVar8->size_alloced;
    local_278 = local_2d0;
    local_270 = pvVar8;
    alignedFree(in_stack_ffffffffffffeed8);
    pvVar8->size_active = local_2b0;
    pvVar8->size_alloced = local_2b8;
  }
  sVar1 = pvVar8->size_active;
  pvVar8->size_active = sVar1 + 1;
  local_880 = pvVar8->items + sVar1;
  local_888 = &local_ce8;
  *(undefined8 *)&local_880->field_0 = local_ce8;
  *(ulong *)((long)&local_880->field_0 + 8) = uStack_ce0;
  local_d60 = local_ea0;
  pvVar8 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_ea0[0] + 0xf),0);
  local_db8 = &local_f38;
  local_dbc = 0;
  local_dc0 = 0;
  local_dc4 = 0;
  local_98c = 0;
  local_990 = 0;
  local_994 = 0;
  local_998 = 0;
  local_9a8 = 0;
  uStack_9a0 = 0;
  local_f38 = 0;
  uStack_f30 = 0;
  local_e00 = &local_f28;
  local_e08 = local_e88;
  local_e10 = &local_f38;
  uVar2 = *local_e88;
  uVar3 = local_e88[1];
  local_ac8 = 0;
  uStack_ac0 = 0;
  local_ab8._0_4_ = (float)uVar2;
  local_ab8._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_ab0._0_4_ = (float)uVar3;
  uStack_ab0._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_a48 = (float)local_ab8 + 0.0;
  fStack_a44 = local_ab8._4_4_ + 0.0;
  fStack_a40 = (float)uStack_ab0 + 0.0;
  fStack_a3c = uStack_ab0._4_4_ + 0.0;
  local_a30 = &local_f28;
  uVar4 = CONCAT44(fStack_a44,local_a48);
  uVar5 = CONCAT44(fStack_a3c,fStack_a40);
  local_bf0 = local_f18;
  local_bf8 = &local_f28;
  local_bfc = local_e8c;
  local_7c8 = &local_c18;
  local_7cc = 0xffffffff;
  local_7d0 = 0xffffffff;
  local_7d4 = 0xffffffff;
  local_7d8 = 0;
  local_4fc = 0;
  local_500 = 0xffffffff;
  local_504 = 0xffffffff;
  local_508 = 0xffffffff;
  local_518 = 0xffffffffffffffff;
  uStack_510 = 0xffffffff;
  local_c18 = 0xffffffffffffffff;
  uStack_c10 = 0xffffffff;
  local_658 = &local_c18;
  local_8a8 = 0xffffffffffffffff;
  uStack_8a0 = 0xffffffff;
  local_6f8 = &local_c38;
  local_c38 = 0xffffffffffffffff;
  uStack_c30 = 0xffffffff;
  local_d08 = local_f28;
  local_910 = local_c48;
  local_708 = local_c58;
  local_584 = local_e8c;
  local_568 = local_e8c;
  local_578 = local_e8c;
  fStack_574 = local_e8c;
  fStack_570 = local_e8c;
  fStack_56c = local_e8c;
  local_6f0 = local_c28;
  local_408 = 0xffffffffffffffff;
  uStack_400 = 0xffffffff;
  uStack_480 = uStack_f20 & 0xffffffff;
  local_348 = 0xffffffffffffffff;
  uStack_340 = 0xffffffff;
  local_498 = 0;
  uStack_494 = 0;
  uStack_490 = 0;
  uStack_6e0 = uStack_480 | (ulong)(uint)local_e8c << 0x20;
  local_6d0 = local_c28;
  local_8d8 = local_c28;
  local_cf8 = local_f18;
  local_850 = &local_d08;
  local_238 = pvVar8->size_active;
  local_b8 = pvVar8->size_active + 1;
  local_cf0 = pvVar8;
  local_ab8 = uVar2;
  uStack_ab0 = uVar3;
  local_858 = local_cf8;
  local_700 = local_910;
  local_6c8 = local_708;
  local_6c0 = local_910;
  local_608 = local_8a8;
  uStack_600 = uStack_8a0;
  local_5f0 = local_6f8;
  local_580 = local_708;
  local_3a8 = local_6f8;
  local_3a0 = local_6f8;
  local_b0 = pvVar8;
  local_f28 = uVar4;
  uStack_f20 = uVar5;
  uStack_f10 = uStack_6e0;
  uStack_d00 = uStack_6e0;
  uStack_c20 = uStack_6e0;
  if (pvVar8->size_alloced < local_b8) {
    local_a8 = local_b8;
    if (pvVar8->size_alloced != 0) {
      local_c0 = pvVar8->size_alloced;
      while (local_c0 < local_b8) {
        local_d0[1] = 1;
        local_d0[0] = local_c0 << 1;
        puVar9 = std::max<unsigned_long>(local_d0 + 1,local_d0);
        local_c0 = *puVar9;
      }
      local_a8 = local_c0;
    }
  }
  else {
    local_a8 = pvVar8->size_alloced;
  }
  local_240 = local_a8;
  uVar6 = local_238;
  if (local_238 < pvVar8->size_active) {
    while (local_248 = uVar6, local_248 < pvVar8->size_active) {
      uVar6 = local_248 + 1;
    }
    pvVar8->size_active = local_238;
  }
  pvVar11 = pvVar8;
  local_230 = pvVar8;
  if (local_a8 == pvVar8->size_alloced) {
    for (local_250 = pvVar8->size_active; local_250 < local_238; local_250 = local_250 + 1) {
      local_20 = pvVar8->items + local_250;
    }
    pvVar8->size_active = local_238;
  }
  else {
    local_258 = pvVar8->items;
    local_228 = local_a8;
    local_220 = pvVar8;
    pVVar10 = (Vec3fx *)alignedMalloc(in_stack_ffffffffffffeee8,(size_t)in_stack_ffffffffffffeee0);
    pvVar8->items = pVVar10;
    for (local_260 = 0; local_260 < pvVar8->size_active; local_260 = local_260 + 1) {
      local_210 = pvVar8->items + local_260;
      local_218 = local_258 + local_260;
      uVar2 = *(undefined8 *)((long)&local_218->field_0 + 8);
      *(undefined8 *)&local_210->field_0 = *(undefined8 *)&local_218->field_0;
      *(undefined8 *)((long)&local_210->field_0 + 8) = uVar2;
    }
    for (local_268 = pvVar8->size_active; local_268 < local_238; local_268 = local_268 + 1) {
      local_18 = pvVar8->items + local_268;
    }
    local_208 = pvVar8->size_alloced;
    local_200 = local_258;
    local_1f8 = pvVar8;
    alignedFree(in_stack_ffffffffffffeed8);
    pvVar8->size_active = local_238;
    pvVar8->size_alloced = local_240;
  }
  sVar1 = pvVar11->size_active;
  pvVar11->size_active = sVar1 + 1;
  local_860 = pvVar11->items + sVar1;
  local_868 = &local_d08;
  *(undefined8 *)&local_860->field_0 = local_d08;
  *(ulong *)((long)&local_860->field_0 + 8) = uStack_d00;
  local_d68 = local_ea0;
  pvVar8 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_ea0[0] + 0xf),0);
  local_da0 = &local_f68;
  local_da4 = 0;
  local_da8 = 0;
  local_dac = 0;
  local_9ac = 0;
  local_9b0 = 0;
  local_9b4 = 0;
  local_9b8 = 0;
  local_9c8 = 0;
  uStack_9c0 = 0;
  local_f68 = 0;
  uStack_f60 = 0;
  local_e18 = &local_f58;
  local_e28 = &local_f68;
  uVar2 = *local_e88;
  uVar3 = local_e88[1];
  local_aa8 = 0;
  uStack_aa0 = 0;
  local_a98._0_4_ = (float)uVar2;
  local_a98._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_a90._0_4_ = (float)uVar3;
  uStack_a90._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_a28 = (float)local_a98 + 0.0;
  fStack_a24 = local_a98._4_4_ + 0.0;
  fStack_a20 = (float)uStack_a90 + 0.0;
  fStack_a1c = uStack_a90._4_4_ + 0.0;
  local_a10 = &local_f58;
  uVar4 = CONCAT44(fStack_a24,local_a28);
  uVar5 = CONCAT44(fStack_a1c,fStack_a20);
  local_b80 = local_f48;
  local_b88 = &local_f58;
  local_b8c = local_e8c;
  local_7e0 = &local_ba8;
  local_7e4 = 0xffffffff;
  local_7e8 = 0xffffffff;
  local_7ec = 0xffffffff;
  local_7f0 = 0;
  local_4dc = 0;
  local_4e0 = 0xffffffff;
  local_4e4 = 0xffffffff;
  local_4e8 = 0xffffffff;
  local_4f8 = 0xffffffffffffffff;
  uStack_4f0 = 0xffffffff;
  local_ba8 = 0xffffffffffffffff;
  uStack_ba0 = 0xffffffff;
  local_660 = &local_ba8;
  local_8b8 = 0xffffffffffffffff;
  uStack_8b0 = 0xffffffff;
  local_748 = &local_bc8;
  local_bc8 = 0xffffffffffffffff;
  uStack_bc0 = 0xffffffff;
  local_d28 = local_f58;
  local_930 = local_bd8;
  local_758 = local_be8;
  local_5a4 = local_e8c;
  local_588 = local_e8c;
  local_598 = local_e8c;
  fStack_594 = local_e8c;
  fStack_590 = local_e8c;
  fStack_58c = local_e8c;
  local_740 = local_bb8;
  local_3e8 = 0xffffffffffffffff;
  uStack_3e0 = 0xffffffff;
  uStack_460 = uStack_f50 & 0xffffffff;
  local_328 = 0xffffffffffffffff;
  uStack_320 = 0xffffffff;
  local_478 = 0;
  uStack_474 = 0;
  uStack_470 = 0;
  uStack_730 = uStack_460 | (ulong)(uint)local_e8c << 0x20;
  local_720 = local_bb8;
  local_8e0 = local_bb8;
  local_d18 = local_f48;
  local_830 = &local_d28;
  local_1c0 = pvVar8->size_active;
  local_88 = pvVar8->size_active + 1;
  local_d10 = pvVar8;
  local_a98 = uVar2;
  uStack_a90 = uVar3;
  local_838 = local_d18;
  local_750 = local_930;
  local_718 = local_758;
  local_710 = local_930;
  local_628 = local_8b8;
  uStack_620 = uStack_8b0;
  local_610 = local_748;
  local_5a0 = local_758;
  local_398 = local_748;
  local_390 = local_748;
  local_80 = pvVar8;
  local_f58 = uVar4;
  uStack_f50 = uVar5;
  uStack_f40 = uStack_730;
  uStack_d20 = uStack_730;
  uStack_bb0 = uStack_730;
  if (pvVar8->size_alloced < local_88) {
    local_78 = local_88;
    if (pvVar8->size_alloced != 0) {
      local_90 = pvVar8->size_alloced;
      while (local_90 < local_88) {
        local_a0[1] = 1;
        local_a0[0] = local_90 << 1;
        puVar9 = std::max<unsigned_long>(local_a0 + 1,local_a0);
        local_90 = *puVar9;
      }
      local_78 = local_90;
    }
  }
  else {
    local_78 = pvVar8->size_alloced;
  }
  local_1c8 = local_78;
  uVar6 = local_1c0;
  if (local_1c0 < pvVar8->size_active) {
    while (local_1d0 = uVar6, local_1d0 < pvVar8->size_active) {
      uVar6 = local_1d0 + 1;
    }
    pvVar8->size_active = local_1c0;
  }
  local_1b8 = pvVar8;
  if (local_78 == pvVar8->size_alloced) {
    for (local_1d8 = pvVar8->size_active; local_1d8 < local_1c0; local_1d8 = local_1d8 + 1) {
      local_30 = pvVar8->items + local_1d8;
    }
    pvVar8->size_active = local_1c0;
  }
  else {
    local_1e0 = pvVar8->items;
    local_1b0 = local_78;
    local_1a8 = pvVar8;
    pVVar10 = (Vec3fx *)alignedMalloc(in_stack_ffffffffffffeee8,(size_t)in_stack_ffffffffffffeee0);
    pvVar8->items = pVVar10;
    for (local_1e8 = 0; local_1e8 < pvVar8->size_active; local_1e8 = local_1e8 + 1) {
      local_198 = pvVar8->items + local_1e8;
      local_1a0 = local_1e0 + local_1e8;
      uVar2 = *(undefined8 *)((long)&local_1a0->field_0 + 8);
      *(undefined8 *)&local_198->field_0 = *(undefined8 *)&local_1a0->field_0;
      *(undefined8 *)((long)&local_198->field_0 + 8) = uVar2;
    }
    for (local_1f0 = pvVar8->size_active; local_1f0 < local_1c0; local_1f0 = local_1f0 + 1) {
      local_28 = pvVar8->items + local_1f0;
    }
    local_190 = pvVar8->size_alloced;
    local_188 = local_1e0;
    local_180 = pvVar8;
    alignedFree(in_stack_ffffffffffffeed8);
    pvVar8->size_active = local_1c0;
    pvVar8->size_alloced = local_1c8;
  }
  sVar1 = pvVar8->size_active;
  pvVar8->size_active = sVar1 + 1;
  local_840 = pvVar8->items + sVar1;
  local_848 = &local_d28;
  *(undefined8 *)&local_840->field_0 = local_d28;
  *(ulong *)((long)&local_840->field_0 + 8) = uStack_d20;
  local_d70 = local_ea0;
  pvVar8 = std::
           vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)(local_ea0[0] + 0xf),0);
  local_d88 = local_f98;
  local_d8c = local_e8c;
  local_d90 = 0;
  local_d94 = 0;
  local_9cc = 0;
  local_9d0 = 0;
  local_9d4 = 0;
  local_9d8 = local_e8c;
  local_a88 = (ulong)(uint)local_e8c;
  uStack_9e0 = 0;
  local_f98[1] = 0;
  local_e30 = local_f98 + 2;
  local_e38 = local_e88;
  local_e40 = local_f98;
  uVar2 = *local_e88;
  uVar3 = local_e88[1];
  uStack_a80 = 0;
  local_a78._0_4_ = (float)uVar2;
  local_a78._4_4_ = (float)((ulong)uVar2 >> 0x20);
  uStack_a70._0_4_ = (float)uVar3;
  uStack_a70._4_4_ = (float)((ulong)uVar3 >> 0x20);
  local_a08 = (float)local_a78 + local_e8c;
  fStack_a04 = local_a78._4_4_ + 0.0;
  fStack_a00 = (float)uStack_a70 + 0.0;
  fStack_9fc = uStack_a70._4_4_ + 0.0;
  local_9f0 = local_f98 + 2;
  uVar4 = CONCAT44(fStack_a04,local_a08);
  uVar5 = CONCAT44(fStack_9fc,fStack_a00);
  local_b10 = local_f78;
  local_b18 = local_f98 + 2;
  local_b1c = local_e8c;
  local_7f8 = &local_b38;
  local_7fc = 0xffffffff;
  local_800 = 0xffffffff;
  local_804 = 0xffffffff;
  local_808 = 0;
  local_4bc = 0;
  local_4c0 = 0xffffffff;
  local_4c4 = 0xffffffff;
  local_4c8 = 0xffffffff;
  local_4d8 = 0xffffffffffffffff;
  uStack_4d0 = 0xffffffff;
  local_b38 = 0xffffffffffffffff;
  uStack_b30 = 0xffffffff;
  local_668 = &local_b38;
  local_8c8 = 0xffffffffffffffff;
  uStack_8c0 = 0xffffffff;
  local_798 = &local_b58;
  local_b58 = 0xffffffffffffffff;
  uStack_b50 = 0xffffffff;
  local_d48 = local_f98[2];
  local_950 = local_b68;
  local_7a8 = local_b78;
  local_5c4 = local_e8c;
  local_5a8 = local_e8c;
  local_5b8 = local_e8c;
  fStack_5b4 = local_e8c;
  fStack_5b0 = local_e8c;
  fStack_5ac = local_e8c;
  local_790 = local_b48;
  local_3c8 = 0xffffffffffffffff;
  uStack_3c0 = 0xffffffff;
  uStack_440 = uStack_f80 & 0xffffffff;
  local_308 = 0xffffffffffffffff;
  uStack_300 = 0xffffffff;
  local_458 = 0;
  uStack_454 = 0;
  uStack_450 = 0;
  uStack_780 = uStack_440 | (ulong)(uint)local_e8c << 0x20;
  local_770 = local_b48;
  local_8e8 = local_b48;
  local_d38 = local_f78;
  local_810 = &local_d48;
  local_148 = pvVar8->size_active;
  local_58 = pvVar8->size_active + 1;
  local_d30 = pvVar8;
  local_a78 = uVar2;
  uStack_a70 = uVar3;
  local_9e8 = local_a88;
  local_818 = local_d38;
  local_7a0 = local_950;
  local_768 = local_7a8;
  local_760 = local_950;
  local_648 = local_8c8;
  uStack_640 = uStack_8c0;
  local_630 = local_798;
  local_5c0 = local_7a8;
  local_388 = local_798;
  local_380 = local_798;
  local_50 = pvVar8;
  local_f98[0] = local_a88;
  local_f98[2] = uVar4;
  uStack_f80 = uVar5;
  uStack_f70 = uStack_780;
  uStack_d40 = uStack_780;
  uStack_b40 = uStack_780;
  if (pvVar8->size_alloced < local_58) {
    local_48 = local_58;
    if (pvVar8->size_alloced != 0) {
      local_60 = pvVar8->size_alloced;
      while (local_60 < local_58) {
        local_70[1] = 1;
        local_70[0] = local_60 << 1;
        puVar9 = std::max<unsigned_long>(local_70 + 1,local_70);
        local_60 = *puVar9;
      }
      local_48 = local_60;
    }
  }
  else {
    local_48 = pvVar8->size_alloced;
  }
  local_150 = local_48;
  uVar6 = local_148;
  if (local_148 < pvVar8->size_active) {
    while (local_158 = uVar6, local_158 < pvVar8->size_active) {
      uVar6 = local_158 + 1;
    }
    pvVar8->size_active = local_148;
  }
  local_140 = pvVar8;
  if (local_48 == pvVar8->size_alloced) {
    for (local_160 = pvVar8->size_active; local_160 < local_148; local_160 = local_160 + 1) {
      local_40 = pvVar8->items + local_160;
    }
    pvVar8->size_active = local_148;
  }
  else {
    local_168 = pvVar8->items;
    local_138 = local_48;
    local_130 = pvVar8;
    pVVar10 = (Vec3fx *)alignedMalloc(in_stack_ffffffffffffeee8,(size_t)in_stack_ffffffffffffeee0);
    pvVar8->items = pVVar10;
    for (local_170 = 0; local_170 < pvVar8->size_active; local_170 = local_170 + 1) {
      local_120 = pvVar8->items + local_170;
      local_128 = local_168 + local_170;
      uVar2 = *(undefined8 *)((long)&local_128->field_0 + 8);
      *(undefined8 *)&local_120->field_0 = *(undefined8 *)&local_128->field_0;
      *(undefined8 *)((long)&local_120->field_0 + 8) = uVar2;
    }
    for (local_178 = pvVar8->size_active; local_178 < local_148; local_178 = local_178 + 1) {
      local_38 = pvVar8->items + local_178;
    }
    local_118 = pvVar8->size_alloced;
    local_110 = local_168;
    local_108 = pvVar8;
    alignedFree(in_stack_ffffffffffffeed8);
    pvVar8->size_active = local_148;
    pvVar8->size_alloced = local_150;
  }
  sVar1 = pvVar8->size_active;
  pvVar8->size_active = sVar1 + 1;
  local_820 = pvVar8->items + sVar1;
  local_828 = &local_d48;
  *(undefined8 *)&local_820->field_0 = local_d48;
  *(ulong *)((long)&local_820->field_0 + 8) = uStack_d40;
  local_b08 = local_ea0;
  local_2f0 = local_ea0[0];
  (in_RDI->super_RefCount)._vptr_RefCount = local_ea0[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_af8 = local_ea0;
  if (local_ea0[0] != (_func_int **)0x0) {
    (**(code **)(*local_ea0[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphereShapedHair(const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),1);
    mesh->hairs.push_back(SceneGraph::HairSetNode::Hair(0,0));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(-radius,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(+radius,0,0),radius));
    return mesh.dynamicCast<SceneGraph::Node>();
  }